

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_setInitialValueByReference_Test::~Variable_setInitialValueByReference_Test
          (Variable_setInitialValueByReference_Test *this)

{
  Variable_setInitialValueByReference_Test *this_local;
  
  ~Variable_setInitialValueByReference_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Variable, setInitialValueByReference)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component>\n"
        "    <variable initial_value=\"referencedVariable\"/>\n"
        "  </component>\n"
        "</model>\n";
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    v1->setName("referencedVariable");
    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    v2->setInitialValue(v1);
    c->addVariable(v2);
    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}